

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O3

void iemgui_receive(void *x,t_iemgui *iemgui,t_symbol *s)

{
  t_iem_fstyle_flags tVar1;
  t_symbol *s_00;
  int iVar2;
  t_iem_fstyle_flags tVar3;
  t_symbol *s_01;
  uint uVar4;
  
  tVar1 = iemgui->x_fsf;
  if (s == (t_symbol *)0x0) {
    iemgui->x_rcv_unexpanded = &s_;
    tVar3 = tVar1;
  }
  else {
    iemgui->x_rcv_unexpanded = s;
    s_01 = canvas_realizedollar(iemgui->x_glist,s);
    if (s_01 != (t_symbol *)0x0) {
      s_00 = iemgui->x_rcv;
      iVar2 = strcmp(s_01->s_name,s_00->s_name);
      uVar4 = 0x40;
      if (iVar2 != 0) {
        if (((uint)iemgui->x_fsf & 0x40) != 0) {
          pd_unbind((t_pd *)iemgui,s_00);
        }
        iemgui->x_rcv = s_01;
        pd_bind((t_pd *)iemgui,s_01);
      }
      goto LAB_001308e3;
    }
    tVar3 = iemgui->x_fsf;
  }
  uVar4 = 0;
  if (((uint)tVar3 & 0x40) != 0) {
    pd_unbind((t_pd *)iemgui,iemgui->x_rcv);
    iemgui->x_rcv = (t_symbol *)0x0;
    uVar4 = 0;
  }
LAB_001308e3:
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffbf | uVar4);
  iemgui_verify_snd_ne_rcv(iemgui);
  iVar2 = glist_isvisible(iemgui->x_glist);
  if (iVar2 != 0) {
    iVar2 = gobj_shouldvis((t_gobj *)x,iemgui->x_glist);
    if (iVar2 != 0) {
      (*iemgui->x_draw)(x,iemgui->x_glist,((uint)tVar1 >> 5 & 2) + ((uint)tVar1 >> 7 & 1) + 6);
      return;
    }
  }
  return;
}

Assistant:

void iemgui_receive(void *x, t_iemgui *iemgui, t_symbol *s)
{
    int oldsndrcvable=0;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;

    if(s) {
        iemgui->x_rcv_unexpanded = s;
        s = canvas_realizedollar(iemgui->x_glist, s);
    } else {
        iemgui->x_rcv_unexpanded = &s_;
    }
    if(s)
    {
        if(strcmp(s->s_name, iemgui->x_rcv->s_name))
        {
            if(iemgui->x_fsf.x_rcv_able)
                pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);
            iemgui->x_rcv = s;
            pd_bind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);
        }
    }
    else if(iemgui->x_fsf.x_rcv_able)
    {
        pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);
        iemgui->x_rcv = s;
    }
    iemgui->x_fsf.x_rcv_able = (s!=0);
    iemgui_verify_snd_ne_rcv(iemgui);
    if(glist_isvisible(iemgui->x_glist) && gobj_shouldvis((t_gobj *)x, iemgui->x_glist))
        (*iemgui->x_draw)(x, iemgui->x_glist, IEM_GUI_DRAW_MODE_IO + oldsndrcvable);
}